

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::Substitute(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint8_t *puVar7;
  uint uVar8;
  uint uVar9;
  uint16_t column_i;
  uint i;
  long lVar10;
  short sVar11;
  uint uVar12;
  uint8_t *vz;
  short sVar13;
  uint8_t *puVar14;
  RowMixIterator mix;
  ushort local_46 [3];
  PeelRow *local_40;
  int local_34;
  
  uVar1 = this->_peel_head_rows;
  do {
    if (uVar1 == 0xffff) {
      return;
    }
    local_40 = this->_peel_rows + uVar1;
    uVar2 = (local_40->Marks).Unmarked[0];
    puVar14 = this->_recovery_blocks;
    uVar9 = this->_block_bytes;
    puVar7 = this->_input_blocks;
    uVar3 = this->_mix_count;
    uVar4 = this->_mix_next_prime;
    local_46[0] = (local_40->Params).MixFirst;
    uVar8 = (uint)local_46[0];
    uVar5 = (local_40->Params).MixAdd;
    lVar10 = 1;
    do {
      uVar8 = ((uVar8 & 0xffff) + (uint)uVar5) % (uint)uVar4;
      if (uVar3 <= uVar8) {
        uVar8 = uVar4 - uVar8;
        uVar12 = uVar8 & 0xffff;
        if (uVar5 < (ushort)uVar8) {
          uVar8 = ((uint)uVar5 * 0x10000 - uVar12) % (uint)uVar5;
        }
        else {
          uVar8 = uVar5 - uVar12;
        }
      }
      local_46[lVar10] = (ushort)uVar8;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    vz = puVar14 + uVar2 * uVar9;
    puVar14 = puVar14 + ((uint)local_46[0] + (uint)this->_block_count) * uVar9;
    if (this->_block_count - 1 == (uint)uVar1) {
      gf256_addset_mem(vz,puVar14,puVar7 + uVar9 * uVar1,this->_input_final_bytes);
      uVar9 = this->_input_final_bytes;
      memcpy(vz + uVar9,puVar14 + uVar9,(ulong)(this->_block_bytes - uVar9));
    }
    else {
      gf256_addset_mem(vz,puVar14,puVar7 + uVar9 * uVar1,uVar9);
    }
    uVar9 = this->_block_bytes;
    gf256_add2_mem(vz,this->_recovery_blocks +
                      ((uint)local_46[1] + (uint)this->_block_count) * uVar9,
                   this->_recovery_blocks + ((uint)local_46[2] + (uint)this->_block_count) * uVar9,
                   uVar9);
    uVar1 = (local_40->Params).PeelCount;
    if (1 < uVar1) {
      uVar3 = this->_block_count;
      uVar4 = this->_block_next_prime;
      uVar5 = (local_40->Params).PeelFirst;
      sVar13 = uVar1 - 1;
      uVar6 = (local_40->Params).PeelAdd;
      uVar8 = (uint)uVar6;
      uVar9 = (uint)uVar5;
      if (sVar13 != 0) {
        sVar13 = uVar1 - 2;
        uVar9 = ((uint)uVar6 + (uint)uVar5) % (uint)uVar4;
        if (uVar3 <= uVar9) {
          uVar12 = uVar4 - uVar9 & 0xffff;
          if (uVar6 < (ushort)(uVar4 - uVar9)) {
            uVar9 = (uVar8 * 0x10000 - uVar12) % uVar8;
          }
          else {
            uVar9 = uVar8 - uVar12;
          }
        }
      }
      if (uVar5 == uVar2) {
        uVar12 = this->_block_bytes;
        puVar14 = this->_recovery_blocks + (uVar9 & 0xffff) * uVar12;
LAB_00108768:
        gf256_add_mem(vz,puVar14,uVar12);
      }
      else {
        uVar12 = this->_block_bytes;
        puVar14 = this->_recovery_blocks + uVar5 * uVar12;
        if ((ushort)uVar9 == uVar2) goto LAB_00108768;
        gf256_add2_mem(vz,puVar14,this->_recovery_blocks + (uVar9 & 0xffff) * uVar12,uVar12);
      }
      local_34 = uVar8 << 0x10;
      while( true ) {
        sVar11 = sVar13;
        if (sVar13 != 0) {
          sVar11 = sVar13 + -1;
          uVar9 = ((uVar9 & 0xffff) + uVar8) % (uint)uVar4;
          if (uVar3 <= uVar9) {
            uVar12 = uVar4 - uVar9 & 0xffff;
            if (uVar6 < (ushort)(uVar4 - uVar9)) {
              uVar9 = (local_34 - uVar12) % uVar8;
            }
            else {
              uVar9 = uVar8 - uVar12;
            }
          }
        }
        if (sVar13 == 0) break;
        sVar13 = sVar11;
        if ((ushort)uVar9 != uVar2) {
          gf256_add_mem(vz,this->_recovery_blocks + (uVar9 & 0xffff) * this->_block_bytes,
                        this->_block_bytes);
        }
      }
    }
    uVar1 = local_40->NextRow;
  } while( true );
}

Assistant:

void Codec::Substitute()
{
    CAT_IF_DUMP(cout << endl << "---- Substitute ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each column that has been peeled:
    for (uint16_t row_i = _peel_head_rows; row_i != LIST_TERM; row_i = row->NextRow)
    {
        row = &_peel_rows[row_i];

        const uint16_t dest_column_i = row->Marks.Result.PeelColumn;
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Generating column " << dest_column_i << ":";)

        const uint8_t * GF256_RESTRICT input_src = _input_blocks + _block_bytes * row_i;
        CAT_IF_DUMP(cout << " " << row_i << ":[" << (unsigned)input_src[0] << "]";)

        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Set up mixing column generator
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

        // If copying from final block:
        if (row_i != _block_count - 1) {
            gf256_addset_mem(dest, src, input_src, _block_bytes);
        }
        else
        {
            gf256_addset_mem(dest, src, input_src, _input_final_bytes);
            memcpy(
                dest + _input_final_bytes,
                src + _input_final_bytes,
                _block_bytes - _input_final_bytes);
        }
        CAT_IF_ROWOP(++rowops;)

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src0 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src1 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);

        // Add next two mixing columns in
        gf256_add2_mem(dest, src0, src1, _block_bytes);

        CAT_IF_ROWOP(++rowops;)

        // If at least two peeling columns are set:
        if (row->Params.PeelCount >= 2) // common case:
        {
            PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

            const uint16_t column_0 = iter.GetColumn();
            iter.Iterate();
            const uint16_t column_1 = iter.GetColumn();

            // Common case:
            if (column_0 != dest_column_i)
            {
                CAT_DEBUG_ASSERT(column_0 < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel0 = _recovery_blocks + _block_bytes * column_0;

                // Common case:
                if (column_1 != dest_column_i) {
                    CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                    gf256_add2_mem(dest, peel0, _recovery_blocks + _block_bytes * column_1, _block_bytes);
                }
                else {
                    gf256_add_mem(dest, peel0, _block_bytes);
                }
            }
            else {
                CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * column_1, _block_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            // For each remaining column:
            while (iter.Iterate())
            {
                const uint16_t column_i = iter.GetColumn();
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel_src = _recovery_blocks + _block_bytes * column_i;

                CAT_IF_DUMP(cout << " " << column_i;)

                // If column is not the solved one:
                if (column_i != dest_column_i)
                {
                    gf256_add_mem(dest, peel_src, _block_bytes);
                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << "[" << (unsigned)peel_src[0] << "]";)
                }
                else {
                    CAT_IF_DUMP(cout << "*";)
                }
            }
        } // end if weight 2

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "Substitute used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}